

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O1

int __thiscall bdQuery::nextQuery(bdQuery *this,bdId *id,bdNodeId *targetNodeId)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  undefined4 uVar3;
  in_addr_t iVar4;
  _Rb_tree_color _Var5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  time_t tVar16;
  long lVar17;
  _Base_ptr p_Var18;
  uint uVar19;
  _Self __tmp;
  uint uVar20;
  bool bVar21;
  bdNodeId midRndId;
  undefined4 local_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 local_34;
  
  if ((this->mState == 2) || ((this->mQueryFlags & 2) != 0)) {
    tVar16 = time((time_t *)0x0);
    lVar17 = (tVar16 - this->mQueryTS) / 2;
    if (this->mQueryIdlePeerRetryPeriod < lVar17) {
      iVar13 = (int)lVar17;
      iVar15 = 0x4b0;
      if (iVar13 < 0x4b0) {
        iVar15 = iVar13;
      }
      this->mQueryIdlePeerRetryPeriod = iVar15;
    }
    p_Var18 = (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->mClosest)._M_t._M_impl.super__Rb_tree_header;
    uVar20 = 0;
    uVar19 = uVar20;
    if ((_Rb_tree_header *)p_Var18 != p_Var1) {
      uVar19 = 0;
      do {
        lVar17 = *(long *)(p_Var18 + 3);
        bVar21 = lVar17 == 0;
        if ((!bVar21) && ((this->mQueryFlags & 2) != 0)) {
          bVar21 = (long)this->mQueryIdlePeerRetryPeriod < tVar16 - lVar17 || lVar17 == 0;
        }
        if ((tVar16 - (long)p_Var18[3]._M_parent < 10 || p_Var18[3]._M_parent == (_Base_ptr)0x0) &&
           (uVar14 = (*this->mFns->_vptr_bdDhtFunctions[2])(), uVar20 < (uVar14 & 0xffff))) {
          uVar19 = 1;
        }
        if (bVar21) {
          *(undefined4 *)((id->id).data + 0x10) = *(undefined4 *)&p_Var18[2]._M_right;
          uVar3 = *(undefined4 *)&p_Var18[1]._M_right;
          iVar4 = *(in_addr_t *)((long)&p_Var18[1]._M_right + 4);
          _Var5 = p_Var18[2]._M_color;
          uVar9 = p_Var18[2].field_0x4;
          uVar10 = p_Var18[2].field_0x5;
          uVar11 = p_Var18[2].field_0x6;
          uVar12 = p_Var18[2].field_0x7;
          uVar6 = *(undefined4 *)((long)&p_Var18[2]._M_parent + 4);
          uVar7 = *(undefined4 *)&p_Var18[2]._M_left;
          uVar8 = *(undefined4 *)((long)&p_Var18[2]._M_left + 4);
          *(undefined4 *)(id->id).data = *(undefined4 *)&p_Var18[2]._M_parent;
          *(undefined4 *)((id->id).data + 4) = uVar6;
          *(undefined4 *)((id->id).data + 8) = uVar7;
          *(undefined4 *)((id->id).data + 0xc) = uVar8;
          (id->addr).sin_family = (short)uVar3;
          (id->addr).sin_port = (short)((uint)uVar3 >> 0x10);
          (id->addr).sin_addr.s_addr = iVar4;
          *(_Rb_tree_color *)(id->addr).sin_zero = _Var5;
          (id->addr).sin_zero[4] = uVar9;
          (id->addr).sin_zero[5] = uVar10;
          (id->addr).sin_zero[6] = uVar11;
          (id->addr).sin_zero[7] = uVar12;
          *(time_t *)(p_Var18 + 3) = tVar16;
          if ((this->mQueryFlags & 1) == 0) {
            *(undefined4 *)(targetNodeId->data + 0x10) = *(undefined4 *)((this->mId).data + 0x10);
            local_44 = *(undefined4 *)(this->mId).data;
            uStack_40 = *(undefined4 *)((this->mId).data + 4);
            uStack_3c = *(undefined4 *)((this->mId).data + 8);
            uStack_38 = *(undefined4 *)((this->mId).data + 0xc);
          }
          else {
            (*this->mFns->_vptr_bdDhtFunctions[9])(this->mFns,this,&id->id,&local_44);
            *(undefined4 *)(targetNodeId->data + 0x10) = local_34;
          }
          *(undefined4 *)targetNodeId->data = local_44;
          *(undefined4 *)(targetNodeId->data + 4) = uStack_40;
          *(undefined4 *)(targetNodeId->data + 8) = uStack_3c;
          *(undefined4 *)(targetNodeId->data + 0xc) = uStack_38;
          return 1;
        }
        p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18);
        uVar20 = uVar20 + 1;
      } while ((_Rb_tree_header *)p_Var18 != p_Var1);
    }
    lVar17 = tVar16 - this->mQueryTS;
    if ((9 < lVar17) &&
       ((300 < lVar17 ||
        (uVar2 = (this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_node_count,
        uVar20 = (*this->mFns->_vptr_bdDhtFunctions[2])(), (uVar20 & 0xffff) <= uVar2 && uVar19 == 0
        )))) {
      if (this->mState == 2) {
        this->mSearchTime = (int)tVar16 - (int)this->mQueryTS;
      }
      removeOldPotentialPeers(this);
      if ((this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        this->mState = 3;
      }
      else {
        iVar15 = operator==((bdNodeId *)
                            &(this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_left
                             [2]._M_parent,&this->mId);
        if ((iVar15 == 0) ||
           ((this->mClosest)._M_t._M_impl.super__Rb_tree_header._M_header._M_left[3]._M_parent ==
            (_Base_ptr)0x0)) {
          iVar15 = operator==((bdNodeId *)
                              &(this->mPotentialPeers)._M_t._M_impl.super__Rb_tree_header._M_header.
                               _M_left[2]._M_parent,&this->mId);
          if (iVar15 == 0) {
            this->mState = 4;
          }
          else {
            this->mState = 5;
          }
        }
        else {
          this->mState = 6;
        }
      }
    }
  }
  return 0;
}

Assistant:

int bdQuery::nextQuery(bdId &id, bdNodeId &targetNodeId) {
	if ((mState != BITDHT_QUERY_QUERYING) && !(mQueryFlags & BITDHT_QFLAGS_DO_IDLE)) {
#ifdef DEBUG_QUERY 
        	fprintf(stderr, "NextQuery() Query is done\n");
#endif
		return 0;
	}

	/* search through through list, find closest not queried */
	time_t now = time(NULL);

	/* update IdlePeerRetry */
	if ((now - mQueryTS) / 2 > mQueryIdlePeerRetryPeriod) {
		mQueryIdlePeerRetryPeriod = (now-mQueryTS) / 2;
		if (mQueryIdlePeerRetryPeriod > MAX_QUERY_IDLE_PERIOD) {
			mQueryIdlePeerRetryPeriod = MAX_QUERY_IDLE_PERIOD;
		}
	}

	bool notFinished = false;
	std::multimap<bdMetric, bdPeer>::iterator it;
	int i = 0;
	for (it = mClosest.begin(); it != mClosest.end(); it++, i++) {
		bool queryPeer = false;

		/* if never queried */
		if (it->second.mLastSendTime == 0) {
#ifdef DEBUG_QUERY 
        		fprintf(stderr, "NextQuery() Found non-sent peer. queryPeer = true : ");
			mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
			std::cerr << std::endl;
#endif
			queryPeer = true;
		}

		/* re-request every so often */
		if ((!queryPeer) && (mQueryFlags & BITDHT_QFLAGS_DO_IDLE) && 
			(now - it->second.mLastSendTime > mQueryIdlePeerRetryPeriod)) {
#ifdef DEBUG_QUERY 
        		fprintf(stderr, "NextQuery() Found out-of-date. queryPeer = true : ");
			mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
			std::cerr << std::endl;
#endif
			queryPeer = true;
		}
		
		/* expecting every peer to be up-to-date is too hard...
		 * enough just to have received lists from each 
		 * - replacement policy will still work.
		 *
		 * Need to wait at least EXPECTED_REPLY, to make sure their answers are pinged
		 */	

		if (((it->second.mLastRecvTime == 0) || (now - it->second.mLastRecvTime < EXPECTED_REPLY)) && 
				(i < mFns->bdNumQueryNodes())) {
#ifdef DEBUG_QUERY 
        		fprintf(stderr, "NextQuery() Never Received @Idx(%d) notFinished = true: ", i);
			mFns->bdPrintId(std::cerr, &(it->second.mPeerId));
			std::cerr << std::endl;
#endif
			notFinished = true;
		}

		if (queryPeer) {
			id = it->second.mPeerId;
			it->second.mLastSendTime = now;

			if (mQueryFlags & BITDHT_QFLAGS_DISGUISE) {
				/* calc Id mid point between Target and Peer */
				bdNodeId midRndId;
				mFns->bdRandomMidId(&mId, &(id.id), &midRndId);

				targetNodeId = midRndId;
			} else
				targetNodeId = mId;

#ifdef DEBUG_QUERY 
        		fprintf(stderr, "NextQuery() Querying Peer: ");
			mFns->bdPrintId(std::cerr, &id);
			std::cerr << std::endl;
#endif
			return 1;
		}
	}

	/* allow query to run for a minimal amount of time
	 * This is important as startup - when we might not have any peers.	
	 * Probably should be handled elsewhere.
	 */
	time_t age = now - mQueryTS;

	if (age < BITDHT_MIN_QUERY_AGE) {
#ifdef DEBUG_QUERY 
       		fprintf(stderr, "NextQuery() under Min Time: Query not finished / No Query\n");
#endif
		return 0;
	}

	if (age > BITDHT_MAX_QUERY_AGE) {
#ifdef DEBUG_QUERY 
       		fprintf(stderr, "NextQuery() over Max Time: Query force to Finish\n");
#endif
		/* fall through and stop */
	} else if ((mClosest.size() < mFns->bdNumQueryNodes()) || (notFinished)) {
#ifdef DEBUG_QUERY 
       		fprintf(stderr, "NextQuery() notFinished | !size(): Query not finished / No Query\n");
#endif
		/* not full yet... */
		return 0;
	}

#ifdef DEBUG_QUERY 
	fprintf(stderr, "NextQuery() Finished\n");
#endif

	/* if we get here - query finished */
	if (mState == BITDHT_QUERY_QUERYING) {
		/* store query time */
		mSearchTime = now - mQueryTS;
	}

	/* cleanup PotentialPeers before doing the final State */;
	removeOldPotentialPeers();
	/* check if we found the node */
	if (mClosest.size() > 0) {
		if (((mClosest.begin()->second).mPeerId.id == mId) && 
			((mClosest.begin()->second).mLastRecvTime != 0))
			mState = BITDHT_QUERY_SUCCESS;
		else if ((mPotentialPeers.begin()->second).mPeerId.id == mId)
			mState = BITDHT_QUERY_PEER_UNREACHABLE;
		else
			mState = BITDHT_QUERY_FOUND_CLOSEST;
	} else
		mState = BITDHT_QUERY_FAILURE;
	return 0;
}